

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _missingAssertions,bool _aborting)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  string *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  string *in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  TestCaseInfo *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  
  bVar5 = in_R9B & 1;
  bVar4 = in_stack_00000008 & 1;
  *in_RDI = &PTR__TestCaseStats_0021ed08;
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)
             (CONCAT17(in_R9B,CONCAT16(in_stack_00000008,in_stack_ffffffffffffffd0)) &
             0x101ffffffffffff),in_stack_ffffffffffffffc8);
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  uVar3 = in_RDX[3];
  in_RDI[0x1f] = in_RDX[2];
  in_RDI[0x20] = uVar3;
  in_RDI[0x1d] = uVar1;
  in_RDI[0x1e] = uVar2;
  std::__cxx11::string::string((string *)(in_RDI + 0x21),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0x25),in_R8);
  *(byte *)(in_RDI + 0x29) = bVar5 & 1;
  *(byte *)((long)in_RDI + 0x149) = bVar4 & 1;
  return;
}

Assistant:

TestCaseStats(  TestCaseInfo const& _testInfo,
                        Totals const& _totals,
                        std::string const& _stdOut,
                        std::string const& _stdErr,
                        bool _missingAssertions,
                        bool _aborting )
        : testInfo( _testInfo ),
            totals( _totals ),
            stdOut( _stdOut ),
            stdErr( _stdErr ),
            missingAssertions( _missingAssertions ),
            aborting( _aborting )
        {}